

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> * __thiscall
soul::StructuralParser::parseEndpointTypeList
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>
           *__return_storage_ptr__,StructuralParser *this,EndpointType endpointType)

{
  SourceCodeText *o;
  size_t sVar1;
  bool bVar2;
  Expression *pEVar3;
  ulong uVar4;
  CodeLocation loc;
  CodeLocation local_78;
  CompileMessage local_68;
  
  __return_storage_ptr__->items = (pool_ref<soul::AST::Expression> *)__return_storage_ptr__->space;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 2;
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_78.location.data = (this->super_SOULTokeniser).location.location.data;
  local_78.sourceCode.object = o;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6d5);
  if (bVar2) {
    while( true ) {
      pEVar3 = parseType(this,eventType);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::reserve
                (__return_storage_ptr__,__return_storage_ptr__->numActive + 1);
      sVar1 = __return_storage_ptr__->numActive;
      __return_storage_ptr__->items[sVar1].object = pEVar3;
      __return_storage_ptr__->numActive = sVar1 + 1;
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
      if (bVar2) break;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fab);
    }
    uVar4 = __return_storage_ptr__->numActive;
  }
  else {
    pEVar3 = parseType(this,eventType);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::reserve
              (__return_storage_ptr__,__return_storage_ptr__->numActive + 1);
    sVar1 = __return_storage_ptr__->numActive;
    __return_storage_ptr__->items[sVar1].object = pEVar3;
    uVar4 = sVar1 + 1;
    __return_storage_ptr__->numActive = uVar4;
  }
  if ((endpointType != event) && (1 < uVar4)) {
    CompileMessageHelpers::createMessage<>
              (&local_68,syntax,error,"Multiple data types not supported by this endpoint type");
    CodeLocation::throwError(&local_78,&local_68);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return __return_storage_ptr__;
}

Assistant:

decltype (AST::EndpointDetails::dataTypes) parseEndpointTypeList (EndpointType endpointType)
    {
        decltype (AST::EndpointDetails::dataTypes) result;
        auto loc = location;

        if (matchIf (Operator::openParen))
        {
            for (;;)
            {
                result.push_back (parseType (ParseTypeContext::eventType));

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }
        else
        {
            result.push_back (parseType (ParseTypeContext::eventType));
        }

        if (! isEvent (endpointType) && result.size() > 1)
            loc.throwError (Errors::noMultipleTypesOnEndpoint());

        return result;
    }